

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_path.cpp
# Opt level: O2

DWORD GetShortPathNameW(LPCWSTR lpszLongPath,LPWSTR lpszShortPath,DWORD cchBuffer)

{
  DWORD DVar1;
  size_t sVar2;
  uint uVar3;
  
  if (PAL_InitializeChakraCoreCalled) {
    if (lpszLongPath == (LPCWSTR)0x0) {
      SetLastError(0x57);
    }
    else {
      DVar1 = GetFileAttributesW(lpszLongPath);
      if (DVar1 != 0xffffffff) {
        sVar2 = PAL_wcslen(lpszLongPath);
        DVar1 = (DWORD)sVar2;
        uVar3 = DVar1 + 1;
        if (lpszShortPath != (LPWSTR)0x0) {
          if (cchBuffer < uVar3) {
            if (PAL_InitializeChakraCoreCalled == false) goto LAB_002d9715;
            SetLastError(0x7a);
          }
          else {
            uVar3 = DVar1;
            if (lpszLongPath != lpszShortPath) {
              PAL_wcsncpy(lpszShortPath,lpszLongPath,(ulong)cchBuffer);
            }
          }
        }
        if (PAL_InitializeChakraCoreCalled != false) {
          return uVar3;
        }
        goto LAB_002d9715;
      }
    }
    if (PAL_InitializeChakraCoreCalled != false) {
      return 0;
    }
  }
LAB_002d9715:
  abort();
}

Assistant:

DWORD
PALAPI
GetShortPathNameW(
		 IN LPCWSTR lpszLongPath,
         OUT LPWSTR lpszShortPath,
  		 IN DWORD cchBuffer)
{
    DWORD dwPathLen = 0;

    PERF_ENTRY(GetShortPathNameW);
    ENTRY("GetShortPathNameW(lpszLongPath=%p (%S), lpszShortPath=%p (%S), "
          "cchBuffer=%d\n", lpszLongPath, lpszLongPath, lpszShortPath, lpszShortPath, cchBuffer);

    if ( !lpszLongPath )
    {
        ERROR( "lpszLongPath was not a valid pointer.\n" );
        SetLastError( ERROR_INVALID_PARAMETER );
        LOGEXIT("GetShortPathNameW returns DWORD 0\n");
        PERF_EXIT(GetShortPathNameW);
        return 0;
    }
    else if (INVALID_FILE_ATTRIBUTES == GetFileAttributesW( lpszLongPath ))
    {
        // last error has been set by GetFileAttributes
        ERROR( "lpszLongPath does not exist.\n" );
        LOGEXIT("GetShortPathNameW returns DWORD 0\n");
        PERF_EXIT(GetShortPathNameW);
        return 0;
    }

    /* all lengths are # of TCHAR characters */
    /* "required size" includes space for the terminating null character */
    dwPathLen = PAL_wcslen(lpszLongPath)+1;

    /* lpszShortPath == 0 means caller is asking only for size */
    if ( lpszShortPath )
    {
        if ( dwPathLen > cchBuffer )
        {
            ERROR("Buffer is too small, need %d characters\n", dwPathLen);
            SetLastError( ERROR_INSUFFICIENT_BUFFER );
        } else
        {
            if ( lpszLongPath != lpszShortPath )
            {
                // Note: MSDN doesn't specify the behavior of GetShortPathName API
                //       if the buffers are overlap.
                PAL_wcsncpy( lpszShortPath, lpszLongPath, cchBuffer );
            }

            /* actual size not including terminating null is returned */
            dwPathLen--;
        }
    }

    LOGEXIT("GetShortPathNameW returns DWORD %u\n", dwPathLen);
    PERF_EXIT(GetShortPathNameW);
    return dwPathLen;
}